

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSphereBoxCollisionAlgorithm.cpp
# Opt level: O3

cbtScalar __thiscall
cbtSphereBoxCollisionAlgorithm::calculateTimeOfImpact
          (cbtSphereBoxCollisionAlgorithm *this,cbtCollisionObject *col0,cbtCollisionObject *col1,
          cbtDispatcherInfo *dispatchInfo,cbtManifoldResult *resultOut)

{
  return 1.0;
}

Assistant:

cbtScalar cbtSphereBoxCollisionAlgorithm::calculateTimeOfImpact(cbtCollisionObject* col0, cbtCollisionObject* col1, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	(void)resultOut;
	(void)dispatchInfo;
	(void)col0;
	(void)col1;

	//not yet
	return cbtScalar(1.);
}